

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O3

PVG_FT_Error PVG_FT_Stroker_BeginSubPath(PVG_FT_Stroker stroker,PVG_FT_Vector *to,PVG_FT_Bool open)

{
  PVG_FT_Pos PVar1;
  bool bVar2;
  
  stroker->first_point = '\x01';
  PVar1 = to->y;
  (stroker->center).x = to->x;
  (stroker->center).y = PVar1;
  stroker->subpath_open = open;
  bVar2 = true;
  if (stroker->line_join == PVG_FT_STROKER_LINEJOIN_ROUND) {
    if (open == '\0') {
      bVar2 = false;
    }
    else {
      bVar2 = stroker->line_cap == PVG_FT_STROKER_LINECAP_BUTT;
    }
  }
  stroker->handle_wide_strokes = bVar2;
  PVar1 = to->y;
  (stroker->subpath_start).x = to->x;
  (stroker->subpath_start).y = PVar1;
  stroker->angle_in = 0;
  return 0;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_BeginSubPath(PVG_FT_Stroker stroker, PVG_FT_Vector* to,
                                       PVG_FT_Bool open)
{
    /* We cannot process the first point, because there is not enough      */
    /* information regarding its corner/cap.  The latter will be processed */
    /* in the `PVG_FT_Stroker_EndSubPath' routine.                             */
    /*                                                                     */
    stroker->first_point = TRUE;
    stroker->center = *to;
    stroker->subpath_open = open;

    /* Determine if we need to check whether the border radius is greater */
    /* than the radius of curvature of a curve, to handle this case       */
    /* specially.  This is only required if bevel joins or butt caps may  */
    /* be created, because round & miter joins and round & square caps    */
    /* cover the negative sector created with wide strokes.               */
    stroker->handle_wide_strokes =
        PVG_FT_BOOL(stroker->line_join != PVG_FT_STROKER_LINEJOIN_ROUND ||
                   (stroker->subpath_open &&
                    stroker->line_cap == PVG_FT_STROKER_LINECAP_BUTT));

    /* record the subpath start point for each border */
    stroker->subpath_start = *to;

    stroker->angle_in = 0;

    return 0;
}